

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void set_str(uchar *p,char *s,size_t l,char f,char *map)

{
  byte in_CL;
  size_t in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_R8;
  uchar c;
  byte local_29;
  size_t local_18;
  byte *local_10;
  byte *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI == (byte *)0x0) {
    local_10 = (byte *)0x1b2a60;
  }
  while( true ) {
    local_29 = *local_10;
    if (local_29 == 0 || local_18 == 0) break;
    if ((0x7f < local_29) || (*(char *)(in_R8 + (ulong)local_29) == '\0')) {
      if ((local_29 < 0x61) || (0x7a < local_29)) {
        local_29 = 0x5f;
      }
      else {
        local_29 = local_29 - 0x20;
      }
    }
    *local_8 = local_29;
    local_18 = local_18 - 1;
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  }
  if (local_18 != 0) {
    memset(local_8,(uint)in_CL,local_18);
  }
  return;
}

Assistant:

static void
set_str(unsigned char *p, const char *s, size_t l, char f, const char *map)
{
	unsigned char c;

	if (s == NULL)
		s = "";
	while ((c = *s++) != 0 && l > 0) {
		if (c >= 0x80 || map[c] == 0)
		 {
			/* illegal character */
			if (c >= 'a' && c <= 'z') {
				/* convert c from a-z to A-Z */
				c -= 0x20;
			} else
				c = 0x5f;
		}
		*p++ = c;
		l--;
	}
	/* If l isn't zero, fill p buffer by the character
	 * which indicated by f. */
	if (l > 0)
		memset(p , f, l);
}